

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,ReverbContainer **c,ReverbContainer **def)

{
  ReverbContainer *pRVar1;
  int id;
  uint local_14;
  
  local_14 = 0;
  if ((arc->r == (FReader *)0x0) && (local_14 = 0, *c != (ReverbContainer *)0x0)) {
    local_14 = (uint)(*c)->ID;
  }
  Serialize(arc,key,(int32_t *)&local_14,(int32_t *)0x0);
  if (arc->r != (FReader *)0x0) {
    pRVar1 = S_FindEnvironment(local_14);
    *c = pRVar1;
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, ReverbContainer *&c, ReverbContainer **def)
{
	int id = (arc.isReading() || c == nullptr) ? 0 : c->ID;
	Serialize(arc, key, id, nullptr);
	if (arc.isReading())
	{
		c = S_FindEnvironment(id);
	}
	return arc;
}